

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O0

void internal_convert_record
               (IOConversionPtr conv,ConvStatus conv_status,void *src,void *dest,
               int data_already_copied)

{
  int iVar1;
  long lVar2;
  char cVar3;
  longlong lVar4;
  long *plVar5;
  long lVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  void *dest_field;
  char *dest_field_addr;
  char *src_field_addr;
  int byte_swap;
  int elements_1;
  FMTypeDesc *type_desc;
  FMFieldPtr src_spec;
  int j;
  _FMgetFieldStruct tmp_src_spec;
  int field;
  FMFormat_conflict f;
  size_t elements;
  FMTypeDesc *next;
  size_t *control_value;
  int i;
  char *in_stack_000000a8;
  char *in_stack_000000b0;
  size_t in_stack_ffffffffffffff60;
  int local_6c;
  long local_68;
  undefined7 in_stack_ffffffffffffffa9;
  undefined8 *local_38;
  void *local_30;
  int local_28;
  
  local_30 = (void *)0x0;
  if (*in_RDI != 0) {
    for (local_28 = 0; local_28 < in_RDI[4]; local_28 = local_28 + 1) {
      for (local_38 = (undefined8 *)(*(long *)(in_RDI + (long)local_28 * 0x12 + 0x2a) + 0x20);
          local_38 != (undefined8 *)0x0; local_38 = (undefined8 *)*local_38) {
        if ((*(int *)(local_38 + 1) == 1) && (*(int *)(local_38 + 3) == 0)) {
          lVar2 = *(long *)(*(long *)(in_RDI + 0xe) + 0x38);
          iVar1 = *(int *)((long)local_38 + 0x1c);
          memset(&local_68,0,0x18);
          local_68 = (long)*(int *)(*(long *)(lVar2 + 0x78) + (long)iVar1 * 0x18 + 0x14);
          lVar4 = get_big_int((FMFieldPtr)
                              CONCAT71(in_stack_ffffffffffffffa9,
                                       (char)*(undefined4 *)
                                              (*(long *)(*(long *)(in_RDI + 0xe) + 0x38) + 0x34)),
                              (void *)CONCAT44(1,*(undefined4 *)
                                                  (*(long *)(lVar2 + 0x78) + (long)iVar1 * 0x18 +
                                                  0x10)));
          if (local_30 == (void *)0x0) {
            local_30 = ffs_malloc(in_stack_ffffffffffffff60);
            for (local_6c = 0; local_6c < *(int *)(lVar2 + 0x44); local_6c = local_6c + 1) {
              *(undefined8 *)((long)local_30 + (long)local_6c * 8) = 0;
            }
            *(void **)(in_RSI + 0x38) = local_30;
          }
          *(longlong *)((long)local_30 + (long)*(int *)((long)local_38 + 0x1c) * 8) = lVar4;
        }
      }
    }
    for (local_28 = 0; local_28 < in_RDI[4]; local_28 = local_28 + 1) {
      plVar5 = (long *)(in_RDI + (long)local_28 * 0x12 + 0x24);
      lVar2 = *(long *)(in_RDI + (long)local_28 * 0x12 + 0x2a);
      lVar6 = get_static_array_element_count
                        (*(FMVarInfoList *)(in_RDI + (long)local_28 * 0x12 + 0x2a));
      cVar3 = (char)in_RDI[(long)local_28 * 0x12 + 0x28];
      if (in_RDI[(long)local_28 * 0x12 + 0x26] == 1) {
        cVar3 = '\0';
      }
      if (*(long *)(in_RDI + (long)local_28 * 0x12 + 0x30) == 0) {
        if ((((((cVar3 != '\0') || ((int)plVar5[1] != in_RDI[(long)local_28 * 0x12 + 0x2e])) ||
              (*(long *)(in_RDI + (long)local_28 * 0x12 + 0x34) != 0)) ||
             ((*(int *)(lVar2 + 0x28) == 0 || (*(int *)(lVar2 + 0x28) == 2)))) ||
            (((int)lVar6 == -1 || (in_RDI[(long)local_28 * 0x12 + 0x32] != 0)))) ||
           (((*(int *)((long)plVar5 + 0xc) == 3 &&
             (*(char *)((long)plVar5 + 0x11) != *(char *)((long)plVar5 + 0x12))) ||
            ((*(int *)((long)plVar5 + 0xc) == 5 && (*(long *)(in_RSI + 0x18) != 0))))))
        goto LAB_00116811;
        memcpy((void *)(in_RCX + *(long *)(in_RDI + (long)local_28 * 0x12 + 0x2c)),
               (void *)(in_RDX + *plVar5),(long)((int)plVar5[1] * (int)lVar6));
      }
      else {
        memcpy((void *)(*(long *)(in_RDI + (long)local_28 * 0x12 + 0x2c) + in_RCX),
               *(void **)(in_RDI + (long)local_28 * 0x12 + 0x30),
               (long)in_RDI[(long)local_28 * 0x12 + 0x2e]);
LAB_00116811:
        new_convert_field(in_stack_000000b0,in_stack_000000a8,(ConvStatus)conv,
                          (IOconvFieldStruct *)conv_status,(FMTypeDesc *)src,dest._4_4_);
      }
    }
    if (local_30 != (void *)0x0) {
      free(local_30);
    }
  }
  return;
}

Assistant:

static void
internal_convert_record(IOConversionPtr conv, ConvStatus conv_status, void *src,
			void *dest, int data_already_copied)
{
    int i;
    size_t *control_value = NULL;
    if (conv->conversion_type == none_required) return;
    for (i = 0; i < conv->conv_count; i++) {
	FMTypeDesc *next = &conv->conversions[i].iovar->type_desc;
	while (next != NULL) {
	    if ((next->type == FMType_array) && 
		(next->static_size == 0)) {
		size_t elements;
		FMFormat f = conv->ioformat->body;
		int field = next->control_field_index;
		struct _FMgetFieldStruct tmp_src_spec;
		memset(&tmp_src_spec, 0, sizeof(tmp_src_spec));
		tmp_src_spec.size = f->field_list[field].field_size;
		tmp_src_spec.offset = f->field_list[field].field_offset;
		tmp_src_spec.data_type = integer_type;
		tmp_src_spec.byte_swap = conv->ioformat->body->byte_reversal;
		elements = get_big_int(&tmp_src_spec, src);
		if (control_value == NULL) {
		    int j;
		    control_value = (size_t *) malloc(sizeof(control_value[0]) * f->field_count);
		    for (j = 0; j < f->field_count; j++)
			control_value[j] = 0;
		    conv_status->control_value = control_value;
		}
		control_value[next->control_field_index] = elements;
	    }
	    next = next->next;
	}
    }
    for (i = 0; i < conv->conv_count; i++) {
	FMFieldPtr src_spec = &conv->conversions[i].src_field;
	FMTypeDesc *type_desc = &conv->conversions[i].iovar->type_desc;
	int elements = get_static_array_element_count(conv->conversions[i].iovar);
	int byte_swap = conv->conversions[i].src_field.byte_swap;
	char *src_field_addr = (char*)src + src_spec->offset;
	char *dest_field_addr = (char*)dest + conv->conversions[i].dest_offset;

	if (conv->conversions[i].src_field.size == 1) byte_swap = 0;
	if (conv->conversions[i].default_value){
	    void *dest_field = (void *) (conv->conversions[i].dest_offset + 
					 (char *) dest);
	    memcpy(dest_field, conv->conversions[i].default_value, 
		   conv->conversions[i].dest_size);
	} else if (!byte_swap &&
		   (src_spec->size == conv->conversions[i].dest_size) &&
		   (conv->conversions[i].subconversion == NULL) &&
		   (type_desc->type != FMType_pointer) &&
		   (type_desc->type != FMType_string) &&
		   (elements != -1 /* var array */) &&
		   (conv->conversions[i].rc_swap == no_row_column_swap) &&
		   ((src_spec->data_type != float_type) || 
		    (src_spec->src_float_format == src_spec->target_float_format)) &&
		   ((src_spec->data_type != string_type) || 
		    ((conv_status->dest_pointer_base) == NULL))) {
	    /* data movement is all that is required */
	    memcpy(dest_field_addr, src_field_addr,
		   src_spec->size * elements);
	    continue;
	}
	new_convert_field(src_field_addr, dest_field_addr, conv_status, 
			  &conv->conversions[i], type_desc, 1);
    }
    if (control_value != NULL) {
	free(control_value);
    }
}